

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_method.c
# Opt level: O2

method_conflict
method_create(klass cls,char *name,size_t args_count,method_impl impl,class_visibility_id visibility
             ,async_id async,method_impl_interface_singleton singleton)

{
  method_conflict __ptr;
  size_t sVar1;
  char *__dest;
  signature psVar2;
  method_interface pmVar3;
  
  __ptr = (method_conflict)malloc(0x30);
  if (__ptr != (method_conflict)0x0) {
    if (name == (char *)0x0) {
      __ptr->name = (char *)0x0;
      __dest = (char *)0x0;
    }
    else {
      sVar1 = strlen(name);
      __dest = (char *)malloc(sVar1 + 1);
      __ptr->name = __dest;
      if (__dest == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        memcpy(__dest,name,sVar1 + 1);
      }
    }
    psVar2 = signature_create(args_count);
    __ptr->s = psVar2;
    if (psVar2 != (signature)0x0) {
      __ptr->cls = cls;
      __ptr->impl = impl;
      __ptr->visibility = visibility;
      __ptr->async = async;
      if (singleton == (method_impl_interface_singleton)0x0) {
        pmVar3 = (method_interface)0x0;
      }
      else {
        pmVar3 = (*singleton)();
      }
      __ptr->iface = pmVar3;
      return __ptr;
    }
    log_write_impl_va("metacall",0x4a,"method_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_method.c"
                      ,3,"Invalid method signature allocation");
    free(__dest);
    free(__ptr);
  }
  return (method_conflict)0x0;
}

Assistant:

method method_create(klass cls, const char *name, size_t args_count, method_impl impl, enum class_visibility_id visibility, enum async_id async, method_impl_interface_singleton singleton)
{
	method m = malloc(sizeof(struct method_type));

	if (m == NULL)
	{
		return NULL;
	}

	if (name != NULL)
	{
		size_t size = strlen(name) + 1;

		m->name = malloc(sizeof(char) * size);

		if (m->name != NULL)
		{
			memcpy(m->name, name, size);
		}
	}
	else
	{
		m->name = NULL;
	}

	m->s = signature_create(args_count);

	if (m->s == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid method signature allocation");

		if (m->name)
		{
			free(m->name);
		}

		free(m);

		return NULL;
	}

	m->cls = cls;
	m->impl = impl;
	m->visibility = visibility;
	m->async = async;
	m->iface = singleton ? singleton() : NULL;

	return m;
}